

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::TokenManager::GetKeyId
          (Error *__return_storage_ptr__,TokenManager *this,ByteArray *aKeyId,CborMap *aToken)

{
  ErrorCode EVar1;
  Error *pEVar2;
  allocator_type local_89;
  uint8_t *keyId;
  undefined1 local_80 [40];
  size_t keyIdLength;
  CborMap coseKey;
  CborMap cnf;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  CborMap::CborMap(&cnf);
  CborMap::CborMap(&coseKey);
  keyId = (uint8_t *)0x0;
  CborMap::Get((Error *)local_80,aToken,8,&cnf);
  pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)local_80);
  EVar1 = pEVar2->mCode;
  std::__cxx11::string::~string((string *)(local_80 + 8));
  if (EVar1 == kNone) {
    CborMap::Get((Error *)local_80,&cnf,1,&coseKey);
    pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)local_80);
    EVar1 = pEVar2->mCode;
    std::__cxx11::string::~string((string *)(local_80 + 8));
    if (EVar1 == kNone) {
      CborMap::Get((Error *)local_80,&coseKey,2,&keyId,&keyIdLength);
      pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)local_80);
      EVar1 = pEVar2->mCode;
      std::__cxx11::string::~string((string *)(local_80 + 8));
      if (EVar1 == kNone) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_80,keyId,
                   keyId + keyIdLength,&local_89);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                  (aKeyId,(_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_80);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_80);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error TokenManager::GetKeyId(ByteArray &aKeyId, const CborMap &aToken) const
{
    Error          error;
    CborMap        cnf;
    CborMap        coseKey;
    const uint8_t *keyId = nullptr;
    size_t         keyIdLength;

    SuccessOrExit(error = aToken.Get(cwt::kCnf, cnf));
    SuccessOrExit(error = cnf.Get(cwt::kCoseKey, coseKey));
    SuccessOrExit(error = coseKey.Get(cose::kKeyId, keyId, keyIdLength));

    aKeyId = {keyId, keyId + keyIdLength};

exit:
    return error;
}